

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  uchar *__ptr;
  float *pfVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  float *pfVar6;
  ulong uVar7;
  ulong uVar8;
  uchar *puVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  float fVar13;
  
  __ptr = stbi__load_and_postprocess_8bit(s,x,y,comp,req_comp);
  if (__ptr == (uchar *)0x0) {
    stbi__g_failure_reason = "unknown image type";
  }
  else {
    uVar4 = *x;
    uVar10 = *y;
    if (req_comp == 0) {
      req_comp = *comp;
    }
    if ((((-1 < (int)(uVar10 | uVar4)) &&
         (((uVar10 == 0 || ((int)uVar4 <= (int)(0x7fffffff / (ulong)uVar10))) &&
          (uVar10 = uVar10 * uVar4, -1 < (int)(req_comp | uVar10))))) &&
        ((req_comp == 0 ||
         (((int)uVar10 <= (int)(0x7fffffff / (ulong)(uint)req_comp) &&
          (req_comp * uVar10 < 0x20000000)))))) &&
       (pfVar1 = (float *)malloc((long)(int)(uVar10 * req_comp * 4)), pfVar1 != (float *)0x0)) {
      uVar4 = req_comp - (uint)((req_comp & 1U) == 0);
      uVar8 = 0;
      uVar5 = 0;
      if (0 < (int)uVar4) {
        uVar5 = (ulong)uVar4;
      }
      lVar3 = (long)req_comp;
      pfVar6 = pfVar1;
      puVar9 = __ptr;
      uVar11 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar11 = uVar8;
      }
      for (; uVar8 != uVar11; uVar8 = uVar8 + 1) {
        for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
          fVar13 = powf((float)puVar9[uVar7] / 255.0,stbi__l2h_gamma);
          pfVar6[uVar7] = fVar13 * stbi__l2h_scale;
        }
        pfVar6 = pfVar6 + lVar3;
        puVar9 = puVar9 + lVar3;
      }
      if ((req_comp & 1U) == 0) {
        lVar2 = (long)(int)uVar4;
        while (bVar12 = uVar11 != 0, uVar11 = uVar11 - 1, bVar12) {
          pfVar1[lVar2] = (float)__ptr[lVar2] / 255.0;
          lVar2 = lVar2 + lVar3;
        }
      }
      free(__ptr);
      return pfVar1;
    }
    free(__ptr);
    stbi__g_failure_reason = "outofmem";
  }
  return (float *)0x0;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      stbi__result_info ri;
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp, &ri);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_and_postprocess_8bit(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}